

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_setmetatable(lua_State *L,int idx)

{
  uint uVar1;
  int iVar2;
  TValue *pTVar3;
  ulong uVar4;
  ulong uVar5;
  int in_ESI;
  lua_State *in_RDI;
  cTValue *o;
  GCtab *mt;
  global_State *g;
  GCobj *o_2;
  TValue *o_1;
  undefined4 in_stack_ffffffffffffff88;
  ErrMsg in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint local_68;
  undefined4 uVar6;
  lua_State *L_00;
  
  pTVar3 = index2adr(in_RDI,in_ESI);
  if (*(int *)((long)in_RDI->top + -4) == -1) {
    L_00 = (lua_State *)0x0;
  }
  else {
    L_00 = (lua_State *)(ulong)in_RDI->top[-1].u32.lo;
  }
  uVar4 = (ulong)(in_RDI->glref).ptr32;
  if ((pTVar3->field_2).it == 0xfffffff4) {
    *(int *)((ulong)(pTVar3->u32).lo + 0x10) = (int)L_00;
    if (((L_00 != (lua_State *)0x0) && ((L_00->marked & 3) != 0)) &&
       ((*(byte *)((ulong)(pTVar3->u32).lo + 4) & 4) != 0)) {
      uVar5 = (ulong)(in_RDI->glref).ptr32;
      uVar1 = (pTVar3->u32).lo;
      uVar4 = (ulong)uVar1;
      *(byte *)(uVar4 + 4) = *(byte *)(uVar4 + 4) & 0xfb;
      *(undefined4 *)(uVar4 + 0xc) = *(undefined4 *)(uVar5 + 0x6c);
      *(uint *)(uVar5 + 0x6c) = uVar1;
    }
  }
  else if ((pTVar3->field_2).it == 0xfffffff3) {
    *(int *)((ulong)(pTVar3->u32).lo + 0x10) = (int)L_00;
    if (((L_00 != (lua_State *)0x0) && ((L_00->marked & 3) != 0)) &&
       ((*(byte *)((ulong)(pTVar3->u32).lo + 4) & 4) != 0)) {
      lj_gc_barrierf((global_State *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (GCobj *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (GCobj *)0x1135e2);
    }
  }
  else {
    iVar2 = lj_trace_flushall(L_00);
    uVar6 = SUB84(L_00,0);
    if (iVar2 != 0) {
      lj_err_caller((lua_State *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    }
    pTVar3 = index2adr(in_RDI,in_ESI);
    if (((pTVar3->field_2).it == 0xfffffffe) || ((pTVar3->field_2).it == 0xfffffffd)) {
      *(undefined4 *)(uVar4 + 0x1f8) = uVar6;
      *(undefined4 *)(uVar4 + 500) = uVar6;
    }
    else {
      if ((pTVar3->field_2).it < 0xffff0000) {
        local_68 = 0xd;
      }
      else if ((int)(pTVar3->field_2).it >> 0xf == -2) {
        local_68 = 3;
      }
      else {
        local_68 = (pTVar3->field_2).it ^ 0xffffffff;
      }
      *(undefined4 *)(uVar4 + 0x198 + (ulong)(local_68 + 0x16) * 4) = uVar6;
    }
  }
  in_RDI->top = in_RDI->top + -1;
  return 1;
}

Assistant:

LUA_API int lua_setmetatable(lua_State *L, int idx)
{
  global_State *g;
  GCtab *mt;
  cTValue *o = index2adr_check(L, idx);
  lj_checkapi_slot(1);
  if (tvisnil(L->top-1)) {
    mt = NULL;
  } else {
    lj_checkapi(tvistab(L->top-1), "top stack slot is not a table");
    mt = tabV(L->top-1);
  }
  g = G(L);
  if (tvistab(o)) {
    setgcref(tabV(o)->metatable, obj2gco(mt));
    if (mt)
      lj_gc_objbarriert(L, tabV(o), mt);
  } else if (tvisudata(o)) {
    setgcref(udataV(o)->metatable, obj2gco(mt));
    if (mt)
      lj_gc_objbarrier(L, udataV(o), mt);
  } else {
    /* Flush cache, since traces specialize to basemt. But not during __gc. */
    if (lj_trace_flushall(L))
      lj_err_caller(L, LJ_ERR_NOGCMM);
    o = index2adr(L, idx);  /* Stack may have been reallocated. */
    if (tvisbool(o)) {
      /* NOBARRIER: basemt is a GC root. */
      setgcref(basemt_it(g, LJ_TTRUE), obj2gco(mt));
      setgcref(basemt_it(g, LJ_TFALSE), obj2gco(mt));
    } else {
      /* NOBARRIER: basemt is a GC root. */
      setgcref(basemt_obj(g, o), obj2gco(mt));
    }
  }
  L->top--;
  return 1;
}